

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minify_tests.c
# Opt level: O1

void cjson_minify_should_remove_single_line_comments(void)

{
  char *json;
  
  json = (char *)malloc(0x3d);
  if (json == (char *)0x0) {
    UnityFail(" Expected Non-NULL",0x31);
  }
  builtin_strncpy(json,"{// this is {} \"some kind\" of [] comment /*, don\'t you see\n}",0x3d);
  cJSON_Minify(json);
  UnityAssertEqualString("{}",json,(char *)0x0,0x35);
  free(json);
  return;
}

Assistant:

static void cjson_minify_should_remove_single_line_comments(void)
{
    const char to_minify[] = "{// this is {} \"some kind\" of [] comment /*, don't you see\n}";

    char* minified = (char*) malloc(sizeof(to_minify));
    TEST_ASSERT_NOT_NULL(minified);
    strcpy(minified, to_minify);

    cJSON_Minify(minified);
    TEST_ASSERT_EQUAL_STRING("{}", minified);

    free(minified);
}